

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::appendWithSep
          (LocaleDisplayNamesImpl *this,UnicodeString *buffer,UnicodeString *src)

{
  UBool UVar1;
  UErrorCode local_3c;
  UnicodeString *pUStack_38;
  UErrorCode status;
  UnicodeString *values [2];
  UnicodeString *src_local;
  UnicodeString *buffer_local;
  LocaleDisplayNamesImpl *this_local;
  
  UVar1 = UnicodeString::isEmpty(buffer);
  if (UVar1 == '\0') {
    local_3c = U_ZERO_ERROR;
    pUStack_38 = buffer;
    values[0] = src;
    SimpleFormatter::formatAndReplace
              (&this->separatorFormat,&stack0xffffffffffffffc8,2,buffer,(int32_t *)0x0,0,&local_3c);
  }
  else {
    UnicodeString::setTo(buffer,src);
  }
  return buffer;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::appendWithSep(UnicodeString& buffer, const UnicodeString& src) const {
    if (buffer.isEmpty()) {
        buffer.setTo(src);
    } else {
        const UnicodeString *values[2] = { &buffer, &src };
        UErrorCode status = U_ZERO_ERROR;
        separatorFormat.formatAndReplace(values, 2, buffer, NULL, 0, status);
    }
    return buffer;
}